

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O0

bool ST_Responder(event_t *ev)

{
  bool bVar1;
  ulong local_38;
  size_t i;
  cheatseq_t *pcStack_28;
  int numcheats;
  cheatseq_t *cheats;
  bool eat;
  event_t *ev_local;
  
  bVar1 = FBoolCVar::operator_cast_to_bool(&allcheats);
  if (bVar1) {
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      bVar1 = CheatCheckList(ev,ST_Responder::cheatlists[local_38],ST_Responder::counts[local_38]);
      if (bVar1) {
        return true;
      }
    }
    ev_local._7_1_ = false;
  }
  else {
    switch(gameinfo.gametype) {
    case GAME_Doom:
      pcStack_28 = DoomCheats;
      i._4_4_ = 0x11;
      break;
    case GAME_Heretic:
      pcStack_28 = HereticCheats;
      i._4_4_ = 0x19;
      break;
    default:
      return false;
    case GAME_Hexen:
      pcStack_28 = HexenCheats;
      i._4_4_ = 0xd;
      break;
    case GAME_Strife:
      pcStack_28 = StrifeCheats;
      i._4_4_ = 0x16;
      break;
    case GAME_Chex:
      pcStack_28 = ChexCheats;
      i._4_4_ = 0xf;
    }
    ev_local._7_1_ = CheatCheckList(ev,pcStack_28,i._4_4_);
  }
  return ev_local._7_1_;
}

Assistant:

bool ST_Responder (event_t *ev)
{
	bool eat = false;

	if (!allcheats)
	{
		cheatseq_t *cheats;
		int numcheats;

		switch (gameinfo.gametype)
		{
		case GAME_Doom:
			cheats = DoomCheats;
			numcheats = countof(DoomCheats);
			break;

		case GAME_Heretic:
			cheats = HereticCheats;
			numcheats = countof(HereticCheats);
			break;

		case GAME_Hexen:
			cheats = HexenCheats;
			numcheats = countof(HexenCheats);
			break;

		case GAME_Strife:
			cheats = StrifeCheats;
			numcheats = countof(StrifeCheats);
			break;

		case GAME_Chex:
			cheats = ChexCheats;
			numcheats = countof(ChexCheats);
			break;

		default:
			return false;
		}
		return CheatCheckList(ev, cheats, numcheats);
	}
	else
	{
		static cheatseq_t *cheatlists[] = { DoomCheats, HereticCheats, HexenCheats, StrifeCheats, ChexCheats, SpecialCheats };
		static int counts[] = { countof(DoomCheats), countof(HereticCheats)-2, countof(HexenCheats), 
								countof(StrifeCheats), countof(ChexCheats)-1, countof(SpecialCheats) };

		for (size_t i=0; i<countof(cheatlists); i++)
		{
			if (CheatCheckList(ev, cheatlists[i], counts[i])) return true;
		}
	}
	return false;
}